

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode Curl_req_abort_sending(Curl_easy *data)

{
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->req).field_0xd1 >> 8 & 1) == 0) {
    Curl_bufq_reset(&(data->req).sendbuf);
    *(uint *)&(data->req).field_0xd1 = *(uint *)&(data->req).field_0xd1 & 0xfffffdff | 0x200;
    (data->req).keepon = (data->req).keepon & 0xffffffd5;
    data_local._4_4_ = req_set_upload_done(data);
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_req_abort_sending(struct Curl_easy *data)
{
  if(!data->req.upload_done) {
    Curl_bufq_reset(&data->req.sendbuf);
    data->req.upload_aborted = TRUE;
    /* no longer KEEP_SEND and KEEP_SEND_PAUSE */
    data->req.keepon &= ~KEEP_SENDBITS;
    return req_set_upload_done(data);
  }
  return CURLE_OK;
}